

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall glu::sl::ShaderParser::parseValue(ShaderParser *this,ValueBlock *valueBlock)

{
  Token TVar1;
  DataType basicType;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  ShaderParser *this_01;
  Value value;
  VarType local_58;
  string valueName;
  
  valueName._M_dataplus._M_p = (pointer)&valueName.field_2;
  valueName._M_string_length = 0;
  valueName.field_2._M_local_buf[0] = '\0';
  TVar1 = this->m_curToken;
  if (TVar1 == TOKEN_OUTPUT) {
    valueBlock = (ValueBlock *)&valueBlock->outputs;
  }
  else if (TVar1 != TOKEN_INPUT) {
    if (TVar1 != TOKEN_UNIFORM) goto LAB_008f2d4c;
    valueBlock = (ValueBlock *)&valueBlock->uniforms;
  }
  this_01 = this;
  advanceToken(this);
  this_00 = (ShaderParser *)(ulong)this->m_curToken;
  basicType = mapDataTypeToken(this_01,this->m_curToken);
  if (basicType == TYPE_INVALID) {
LAB_008f2d10:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                   "unexpected token when parsing value data type: ",&this->m_curTokenStr);
    parseError(this,(string *)&value);
  }
  else {
    advanceToken(this);
    if (this->m_curToken == TOKEN_STRING) {
      parseStringLiteral_abi_cxx11_((string *)&value,this_00,(this->m_curTokenStr)._M_dataplus._M_p)
      ;
      std::__cxx11::string::operator=((string *)&valueName,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
LAB_008f2c13:
      advanceToken(this);
      advanceToken(this,TOKEN_ASSIGN);
      Value::Value(&value);
      std::__cxx11::string::_M_assign((string *)&value.name);
      VarType::VarType(&local_58,basicType,PRECISION_LAST);
      VarType::operator=(&value.type,&local_58);
      VarType::~VarType(&local_58);
      std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::push_back
                (&valueBlock->inputs,&value);
      Value::~Value(&value);
      if (this->m_curToken != TOKEN_LEFT_BRACKET) {
        parseValueElement(this,basicType,
                          (valueBlock->inputs).
                          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1);
LAB_008f2ccf:
        advanceToken(this,TOKEN_SEMI_COLON);
        std::__cxx11::string::~string((string *)&valueName);
        return;
      }
      advanceToken(this,TOKEN_LEFT_BRACKET);
      while( true ) {
        parseValueElement(this,basicType,
                          (valueBlock->inputs).
                          super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
                          _M_impl.super__Vector_impl_data._M_finish + -1);
        if (this->m_curToken != TOKEN_VERTICAL_BAR) break;
        advanceToken(this);
      }
      if (this->m_curToken == TOKEN_RIGHT_BRACKET) {
        advanceToken(this,TOKEN_RIGHT_BRACKET);
        goto LAB_008f2ccf;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                     "unexpected token in value element array: ",&this->m_curTokenStr);
      parseError(this,(string *)&value);
      goto LAB_008f2d10;
    }
    if (this->m_curToken == TOKEN_IDENTIFIER) {
      std::__cxx11::string::_M_assign((string *)&valueName);
      goto LAB_008f2c13;
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&value,
                 "unexpected token when parsing value name: ",&this->m_curTokenStr);
  parseError(this,(string *)&value);
LAB_008f2d4c:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&value,"unexpected token encountered when parsing value classifier",
             (allocator<char> *)&local_58);
  parseError(this,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  std::__cxx11::string::~string((string *)&valueName);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseValue (ValueBlock& valueBlock)
{
	PARSE_DBG(("      parseValue()\n"));

	// Parsed results.
	vector<Value>*	dstBlock	= DE_NULL;
	DataType		basicType	= TYPE_LAST;
	std::string		valueName;

	// Parse storage.
	if (m_curToken == TOKEN_UNIFORM)
		dstBlock = &valueBlock.uniforms;
	else if (m_curToken == TOKEN_INPUT)
		dstBlock = &valueBlock.inputs;
	else if (m_curToken == TOKEN_OUTPUT)
		dstBlock = &valueBlock.outputs;
	else
		parseError(string("unexpected token encountered when parsing value classifier"));
	advanceToken();

	// Parse data type.
	basicType = mapDataTypeToken(m_curToken);
	if (basicType == TYPE_INVALID)
		parseError(string("unexpected token when parsing value data type: " + m_curTokenStr));
	advanceToken();

	// Parse value name.
	if (m_curToken == TOKEN_IDENTIFIER || m_curToken == TOKEN_STRING)
	{
		if (m_curToken == TOKEN_IDENTIFIER)
			valueName = m_curTokenStr;
		else
			valueName = parseStringLiteral(m_curTokenStr.c_str());
	}
	else
		parseError(string("unexpected token when parsing value name: " + m_curTokenStr));
	advanceToken();

	// Parse assignment operator.
	advanceToken(TOKEN_ASSIGN);

	{
		Value value;
		value.name	= valueName;
		value.type	= VarType(basicType, PRECISION_LAST);
		dstBlock->push_back(value);
	}

	// Parse actual value.
	if (m_curToken == TOKEN_LEFT_BRACKET) // value list
	{
		int	arrayLength	= 0; // \todo [2015-08-03 pyry] Currently unused

		advanceToken(TOKEN_LEFT_BRACKET);

		for (;;)
		{
			parseValueElement(basicType, dstBlock->back());
			arrayLength++;

			if (m_curToken == TOKEN_RIGHT_BRACKET)
				break;
			else if (m_curToken == TOKEN_VERTICAL_BAR)
			{
				advanceToken();
				continue;
			}
			else
				parseError(string("unexpected token in value element array: " + m_curTokenStr));
		}

		advanceToken(TOKEN_RIGHT_BRACKET);
	}
	else //  single elements
	{
		parseValueElement(basicType, dstBlock->back());
	}

	advanceToken(TOKEN_SEMI_COLON); // end of declaration
}